

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair1_pipe_send(pair1_pipe *p,nni_msg *m)

{
  pair1_sock *ppVar1;
  _Bool _Var2;
  uint32_t uVar3;
  size_t sVar4;
  pair1_sock *s;
  nni_msg *m_local;
  pair1_pipe *p_local;
  
  ppVar1 = p->pair;
  _Var2 = nni_msg_shared(m);
  if (_Var2) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair.c"
              ,0x1fd,"!nni_msg_shared(m)");
  }
  if ((ppVar1->inject_header & 1U) == 0) {
    sVar4 = nni_msg_header_len(m);
    if (sVar4 != 4) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair.c"
                ,0x204,"nni_msg_header_len(m) == sizeof(uint32_t)");
    }
    uVar3 = nni_msg_header_peek_u32(m);
    nni_msg_header_poke_u32(m,uVar3 + 1);
  }
  nni_aio_set_msg(&p->aio_send,m);
  nni_pipe_send(p->pipe,&p->aio_send);
  ppVar1->wr_ready = false;
  return;
}

Assistant:

static void
pair1_pipe_send(pair1_pipe *p, nni_msg *m)
{
	pair1_sock *s = p->pair;
	// assumption: we have unique access to the message at this point.
	NNI_ASSERT(!nni_msg_shared(m));

#ifdef NNG_TEST_LIB
	if (s->inject_header) {
		goto inject;
	}
#endif
	NNI_ASSERT(nni_msg_header_len(m) == sizeof(uint32_t));
	nni_msg_header_poke_u32(m, nni_msg_header_peek_u32(m) + 1);

#ifdef NNG_TEST_LIB
inject:
#endif

	nni_aio_set_msg(&p->aio_send, m);
	nni_pipe_send(p->pipe, &p->aio_send);
	s->wr_ready = false;
}